

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GEN_Register.cpp
# Opt level: O0

void __thiscall GEN_Register::setReg_8(GEN_Register *this,string *flagName,uint8_t value)

{
  bool bVar1;
  _Base_bitset<1UL> local_60;
  _Base_bitset<1UL> local_58;
  _Base_bitset<1UL> local_50;
  _Base_bitset<1UL> local_48;
  _Base_bitset<1UL> local_40;
  _Base_bitset<1UL> local_38;
  _Base_bitset<1UL> local_30;
  _Base_bitset<1UL> local_28;
  byte local_19;
  string *psStack_18;
  uint8_t value_local;
  string *flagName_local;
  GEN_Register *this_local;
  
  local_19 = value;
  psStack_18 = flagName;
  flagName_local = (string *)this;
  bVar1 = std::operator==(flagName,"AL");
  if (bVar1) {
    std::bitset<8UL>::bitset((bitset<8UL> *)&local_28,(ulong)local_19);
    AL.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)local_28._M_w;
  }
  else {
    bVar1 = std::operator==(flagName,"AH");
    if (bVar1) {
      std::bitset<8UL>::bitset((bitset<8UL> *)&local_30,(ulong)local_19);
      AH.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)local_30._M_w;
    }
    else {
      bVar1 = std::operator==(flagName,"DL");
      if (bVar1) {
        std::bitset<8UL>::bitset((bitset<8UL> *)&local_38,(ulong)local_19);
        DL.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)local_38._M_w;
      }
      else {
        bVar1 = std::operator==(flagName,"DH");
        if (bVar1) {
          std::bitset<8UL>::bitset((bitset<8UL> *)&local_40,(ulong)local_19);
          DH.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)local_40._M_w;
        }
        else {
          bVar1 = std::operator==(flagName,"CL");
          if (bVar1) {
            std::bitset<8UL>::bitset((bitset<8UL> *)&local_48,(ulong)local_19);
            CL.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)local_48._M_w;
          }
          else {
            bVar1 = std::operator==(flagName,"CH");
            if (bVar1) {
              std::bitset<8UL>::bitset((bitset<8UL> *)&local_50,(ulong)local_19);
              CH.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)local_50._M_w;
            }
            else {
              bVar1 = std::operator==(flagName,"BL");
              if (bVar1) {
                std::bitset<8UL>::bitset((bitset<8UL> *)&local_58,(ulong)local_19);
                BL.super__Base_bitset<1UL>._M_w =
                     (_Base_bitset<1UL>)(_Base_bitset<1UL>)local_58._M_w;
              }
              else {
                bVar1 = std::operator==(flagName,"BH");
                if (bVar1) {
                  std::bitset<8UL>::bitset((bitset<8UL> *)&local_60,(ulong)local_19);
                  BH.super__Base_bitset<1UL>._M_w =
                       (_Base_bitset<1UL>)(_Base_bitset<1UL>)local_60._M_w;
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void GEN_Register::setReg_8(std::string flagName, uint8_t value)
{
	if (flagName == "AL")
	{
		AL = std::bitset<8>(value);
	} else if (flagName == "AH")
	{
		AH = std::bitset<8>(value);
	}
    else if (flagName == "DL")
    {
        DL = std::bitset<8>(value);
    } else if (flagName == "DH")
    {
        DH = std::bitset<8>(value);
    }
    else if (flagName == "CL")
    {
        CL = std::bitset<8>(value);
    } else if (flagName == "CH")
    {
        CH = std::bitset<8>(value);
    }
    else if (flagName == "BL")
    {
        BL = std::bitset<8>(value);
    } else if (flagName == "BH")
    {
        BH = std::bitset<8>(value);
    }
}